

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_tag_content
              (yaml_emitter_t *emitter,yaml_char_t *value,size_t length,int need_whitespace)

{
  yaml_char_t yVar1;
  byte bVar2;
  yaml_char_t *pyVar3;
  int iVar4;
  char cVar5;
  yaml_char_t *pyVar6;
  int local_68;
  int local_64;
  int local_60;
  int local_4c;
  uint value_1;
  int width;
  yaml_string_t string;
  int need_whitespace_local;
  size_t length_local;
  yaml_char_t *value_local;
  yaml_emitter_t *emitter_local;
  
  string.end = value;
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
      return 0;
    }
    pyVar3 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar3 + 1;
    *pyVar3 = ' ';
    emitter->column = emitter->column + 1;
  }
  do {
    while( true ) {
      if (string.end == value + length) {
        emitter->whitespace = 0;
        emitter->indention = 0;
        return 1;
      }
      if ((((((*string.end < 0x30) || (0x39 < *string.end)) &&
            ((*string.end < 0x41 || (0x5a < *string.end)))) &&
           ((((((*string.end < 0x61 || (0x7a < *string.end)) && (*string.end != '_')) &&
              ((*string.end != '-' && (*string.end != ';')))) && (*string.end != '/')) &&
            ((*string.end != '?' && (*string.end != ':')))))) && (*string.end != '@')) &&
         ((((((*string.end != '&' && (*string.end != '=')) && (*string.end != '+')) &&
            (((*string.end != '$' && (*string.end != ',')) &&
             ((*string.end != '_' && ((*string.end != '.' && (*string.end != '~')))))))) &&
           ((*string.end != '*' &&
            (((*string.end != '\'' && (*string.end != '(')) && (*string.end != ')')))))) &&
          ((*string.end != '[' && (*string.end != ']')))))) break;
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      if ((*string.end & 0x80) == 0) {
        yVar1 = *string.end;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        string.end = string.end + 1;
      }
      else if ((*string.end & 0xe0) == 0xc0) {
        pyVar6 = string.end + 1;
        yVar1 = *string.end;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        string.end = string.end + 2;
        yVar1 = *pyVar6;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
      }
      else if ((*string.end & 0xf0) == 0xe0) {
        yVar1 = *string.end;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        pyVar6 = string.end + 2;
        yVar1 = string.end[1];
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        string.end = string.end + 3;
        yVar1 = *pyVar6;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
      }
      else if ((*string.end & 0xf8) == 0xf0) {
        yVar1 = *string.end;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        yVar1 = string.end[1];
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        pyVar6 = string.end + 3;
        yVar1 = string.end[2];
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
        string.end = string.end + 4;
        yVar1 = *pyVar6;
        pyVar3 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar3 + 1;
        *pyVar3 = yVar1;
      }
      emitter->column = emitter->column + 1;
    }
    if ((*string.end & 0x80) == 0) {
      local_60 = 1;
    }
    else {
      if ((*string.end & 0xe0) == 0xc0) {
        local_64 = 2;
      }
      else {
        if ((*string.end & 0xf0) == 0xe0) {
          local_68 = 3;
        }
        else {
          local_68 = 0;
          if ((*string.end & 0xf8) == 0xf0) {
            local_68 = 4;
          }
        }
        local_64 = local_68;
      }
      local_60 = local_64;
    }
    local_4c = local_60;
    while (local_4c != 0) {
      bVar2 = *string.end;
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      pyVar3 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar3 + 1;
      *pyVar3 = '%';
      emitter->column = emitter->column + 1;
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      cVar5 = '7';
      if (bVar2 >> 4 < 10) {
        cVar5 = '0';
      }
      pyVar3 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar3 + 1;
      *pyVar3 = (bVar2 >> 4) + cVar5;
      emitter->column = emitter->column + 1;
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      cVar5 = '7';
      if ((bVar2 & 0xf) < 10) {
        cVar5 = '0';
      }
      pyVar3 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar3 + 1;
      *pyVar3 = (bVar2 & 0xf) + cVar5;
      emitter->column = emitter->column + 1;
      local_4c = local_4c + -1;
      string.end = string.end + 1;
    }
  } while( true );
}

Assistant:

static int
yaml_emitter_write_tag_content(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length,
        int need_whitespace)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (IS_ALPHA(string)
                || CHECK(string, ';') || CHECK(string, '/')
                || CHECK(string, '?') || CHECK(string, ':')
                || CHECK(string, '@') || CHECK(string, '&')
                || CHECK(string, '=') || CHECK(string, '+')
                || CHECK(string, '$') || CHECK(string, ',')
                || CHECK(string, '_') || CHECK(string, '.')
                || CHECK(string, '~') || CHECK(string, '*')
                || CHECK(string, '\'') || CHECK(string, '(')
                || CHECK(string, ')') || CHECK(string, '[')
                || CHECK(string, ']')) {
            if (!WRITE(emitter, string)) return 0;
        }
        else {
            int width = WIDTH(string);
            unsigned int value;
            while (width --) {
                value = *(string.pointer++);
                if (!PUT(emitter, '%')) return 0;
                if (!PUT(emitter, (value >> 4)
                            + ((value >> 4) < 10 ? '0' : 'A' - 10)))
                    return 0;
                if (!PUT(emitter, (value & 0x0F)
                            + ((value & 0x0F) < 10 ? '0' : 'A' - 10)))
                    return 0;
            }
        }
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}